

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O2

_Bool plutovg_matrix_parse(plutovg_matrix_t *matrix,char *data,int length)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  char *end;
  float fVar4;
  float fVar5;
  _Bool has_trailing_comma;
  float values [6];
  char *it;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  plutovg_matrix_t local_48;
  
  matrix->a = 1.0;
  matrix->b = 0.0;
  matrix->c = 0.0;
  matrix->d = 1.0;
  matrix->e = 0.0;
  matrix->f = 0.0;
  if (length == -1) {
    sVar3 = strlen(data);
    length = (int)sVar3;
  }
  end = data + length;
  has_trailing_comma = false;
  it = data;
  plutovg_skip_ws(&it,end);
  do {
    if (end <= it) {
      return (_Bool)(has_trailing_comma ^ 1);
    }
    _Var1 = plutovg_skip_string(&it,end,"matrix");
    if (_Var1) {
      iVar2 = parse_matrix_parameters(&it,end,values,6,0);
      if (iVar2 == 0) {
        return false;
      }
      local_48.e = values[4];
      local_48.f = values[5];
      plutovg_matrix_multiply(matrix,&local_48,matrix);
    }
    else {
      _Var1 = plutovg_skip_string(&it,end,"translate");
      if (_Var1) {
        iVar2 = parse_matrix_parameters(&it,end,values,1,1);
        fVar4 = values[0];
        if (iVar2 == 1) {
          fVar5 = 0.0;
        }
        else {
          fVar5 = values[1];
          if (iVar2 == 0) {
            return false;
          }
        }
LAB_00106b10:
        plutovg_matrix_translate(matrix,fVar4,fVar5);
      }
      else {
        _Var1 = plutovg_skip_string(&it,end,"scale");
        if (_Var1) {
          iVar2 = parse_matrix_parameters(&it,end,values,1,1);
          fVar4 = values[0];
          if ((iVar2 != 1) && (fVar4 = values[1], iVar2 == 0)) {
            return false;
          }
          plutovg_matrix_scale(matrix,values[0],fVar4);
        }
        else {
          _Var1 = plutovg_skip_string(&it,end,"rotate");
          if (_Var1) {
            iVar2 = parse_matrix_parameters(&it,end,values,1,2);
            if (iVar2 == 3) {
              local_68 = ZEXT416((uint)values[1]);
              local_58 = ZEXT416((uint)values[2]);
              plutovg_matrix_translate(matrix,values[1],values[2]);
              plutovg_matrix_rotate(matrix,values[0] * 0.017453292);
              fVar4 = -(float)local_68._0_4_;
              fVar5 = -(float)local_58._0_4_;
              goto LAB_00106b10;
            }
            if (iVar2 == 0) {
              return false;
            }
            plutovg_matrix_rotate(matrix,values[0] * 0.017453292);
          }
          else {
            _Var1 = plutovg_skip_string(&it,end,"skewX");
            if (_Var1) {
              iVar2 = parse_matrix_parameters(&it,end,values,1,0);
              if (iVar2 == 0) {
                return false;
              }
              fVar4 = values[0] * 0.017453292;
              fVar5 = 0.0;
            }
            else {
              _Var1 = plutovg_skip_string(&it,end,"skewY");
              if (!_Var1) {
                return false;
              }
              iVar2 = parse_matrix_parameters(&it,end,values,1,0);
              if (iVar2 == 0) {
                return false;
              }
              fVar5 = values[0] * 0.017453292;
              fVar4 = 0.0;
            }
            plutovg_matrix_shear(matrix,fVar4,fVar5);
          }
        }
      }
    }
    plutovg_skip_ws_or_comma(&it,end,&has_trailing_comma);
  } while( true );
}

Assistant:

bool plutovg_matrix_parse(plutovg_matrix_t* matrix, const char* data, int length)
{
    float values[6];
    plutovg_matrix_init_identity(matrix);
    if(length == -1)
        length = strlen(data);
    const char* it = data;
    const char* end = it + length;
    bool has_trailing_comma = false;
    plutovg_skip_ws(&it, end);
    while(it < end) {
        if(plutovg_skip_string(&it, end, "matrix")) {
            int count = parse_matrix_parameters(&it, end, values, 6, 0);
            if(count == 0)
                return false;
            plutovg_matrix_t m = { values[0], values[1], values[2], values[3], values[4], values[5] };
            plutovg_matrix_multiply(matrix, &m, matrix);
        } else if(plutovg_skip_string(&it, end, "translate")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 1);
            if(count == 0)
                return false;
            if(count == 1) {
                plutovg_matrix_translate(matrix, values[0], 0);
            } else {
                plutovg_matrix_translate(matrix, values[0], values[1]);
            }
        } else if(plutovg_skip_string(&it, end, "scale")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 1);
            if(count == 0)
                return false;
            if(count == 1) {
                plutovg_matrix_scale(matrix, values[0], values[0]);
            } else {
                plutovg_matrix_scale(matrix, values[0], values[1]);
            }
        } else if(plutovg_skip_string(&it, end, "rotate")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 2);
            if(count == 0)
                return false;
            if(count == 3)
                plutovg_matrix_translate(matrix, values[1], values[2]);
            plutovg_matrix_rotate(matrix, PLUTOVG_DEG2RAD(values[0]));
            if(count == 3) {
                plutovg_matrix_translate(matrix, -values[1], -values[2]);
            }
        } else if(plutovg_skip_string(&it, end, "skewX")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 0);
            if(count == 0)
                return false;
            plutovg_matrix_shear(matrix, PLUTOVG_DEG2RAD(values[0]), 0);
        } else if(plutovg_skip_string(&it, end, "skewY")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 0);
            if(count == 0)
                return false;
            plutovg_matrix_shear(matrix, 0, PLUTOVG_DEG2RAD(values[0]));
        } else {
            return false;
        }

        plutovg_skip_ws_or_comma(&it, end, &has_trailing_comma);
    }

    return !has_trailing_comma;
}